

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadNameSection(BinaryReader *this,Offset section_size)

{
  uint uVar1;
  bool bVar2;
  Result RVar3;
  Index IVar4;
  Index IVar5;
  undefined1 local_170 [8];
  string_view name_1;
  uint local_158;
  Index index;
  Index j_2;
  uint local_14c;
  size_t sStack_148;
  Index num_names_1;
  size_t local_140;
  Enum local_134;
  Enum local_130;
  Enum local_12c;
  undefined1 local_128 [8];
  string_view local_name;
  Index local_index;
  Index k;
  Index last_local_index;
  uint local_104;
  Enum local_100;
  Index num_locals;
  uint local_f8;
  Index function_index_1;
  Index j_1;
  Index last_function_index_1;
  uint local_e8;
  Enum local_e4;
  Index num_funcs;
  size_t local_d8;
  Enum local_cc;
  Enum local_c8;
  Enum local_c4;
  undefined1 local_c0 [8];
  string_view function_name;
  uint local_a8;
  Index function_index;
  Index j;
  Index last_function_index;
  uint local_98;
  Enum local_94;
  Index num_names;
  size_t local_88;
  Enum local_80;
  Enum local_7c;
  undefined1 local_78 [8];
  string_view name;
  undefined1 local_58 [4];
  NameSectionSubsection type;
  ReadEndRestoreGuard guard;
  size_t subsection_end;
  Offset local_38;
  Offset subsection_size;
  uint32_t name_type;
  uint32_t previous_subsection_type;
  Index i;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _i = section_size;
  section_size_local = (Offset)this;
  previous_subsection_type = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa7])();
  bVar2 = Succeeded((Result)previous_subsection_type);
  if (bVar2) {
    name_type = 0;
    subsection_size._4_4_ = 0;
    do {
      if (this->read_end_ <= (this->state_).offset) {
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])();
        bVar2 = Succeeded(RVar3);
        if (!bVar2) {
          PrintError(this,"EndNamesSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        Result::Result((Result *)((long)&this_local + 4),Ok);
        return (Result)this_local._4_4_;
      }
      RVar3 = ReadU32Leb128(this,(uint32_t *)&subsection_size,"name type");
      bVar2 = Failed(RVar3);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      if (name_type != 0) {
        if ((uint)subsection_size == subsection_size._4_4_) {
          PrintError(this,"duplicate sub-section");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        if ((uint)subsection_size < subsection_size._4_4_) {
          PrintError(this,"out-of-order sub-section");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
      }
      subsection_size._4_4_ = (uint)subsection_size;
      RVar3 = ReadOffset(this,&local_38,"subsection size");
      bVar2 = Failed(RVar3);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      guard.previous_value_ = (this->state_).offset + local_38;
      if (this->read_end_ < guard.previous_value_) {
        PrintError(this,"invalid sub-section size: extends past end");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
      ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                         *)local_58,this);
      uVar1 = (uint)subsection_size;
      this->read_end_ = guard.previous_value_;
      if ((int)(uint)subsection_size < 0xc) {
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])
                                (this->delegate_,(ulong)name_type,(ulong)(uint)subsection_size,
                                 local_38);
        bVar2 = Succeeded(RVar3);
        if (bVar2) goto LAB_001dd748;
        PrintError(this,"OnNameSubsection callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
        name._M_str._4_4_ = 1;
        goto LAB_001de488;
      }
LAB_001dd748:
      switch(uVar1) {
      case 0:
        name._M_str._0_4_ =
             (*this->delegate_->_vptr_BinaryReaderDelegate[0xa8])
                       (this->delegate_,(ulong)name_type,(ulong)(uint)subsection_size,local_38);
        bVar2 = Succeeded(name._M_str._0_4_);
        if (bVar2) {
          if (local_38 == 0) goto LAB_001de431;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_78);
          local_7c = (Enum)ReadStr(this,(string_view *)local_78,"module name");
          bVar2 = Failed((Result)local_7c);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            name._M_str._4_4_ = 1;
          }
          else {
            _num_names = (size_t)local_78;
            local_88 = name._M_len;
            local_80 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa9])
                                 (this->delegate_,local_78,name._M_len);
            bVar2 = Succeeded((Result)local_80);
            if (bVar2) goto LAB_001de431;
            PrintError(this,"OnModuleName callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            name._M_str._4_4_ = 1;
          }
        }
        else {
          PrintError(this,"OnModuleNameSubsection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          name._M_str._4_4_ = 1;
        }
        break;
      case 1:
        local_94 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaa])
                             (this->delegate_,(ulong)name_type,(ulong)(uint)subsection_size,local_38
                             );
        bVar2 = Succeeded((Result)local_94);
        if (bVar2) {
          if (local_38 == 0) goto LAB_001de431;
          RVar3 = ReadCount(this,&local_98,"name count");
          bVar2 = Failed(RVar3);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            name._M_str._4_4_ = 1;
          }
          else {
            RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xab])();
            bVar2 = Succeeded(RVar3);
            if (bVar2) {
              function_index = 0xffffffff;
              for (local_a8 = 0; local_a8 < local_98; local_a8 = local_a8 + 1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_c0);
                local_c4 = (Enum)ReadIndex(this,(Index *)((long)&function_name._M_str + 4),
                                           "function index");
                bVar2 = Failed((Result)local_c4);
                uVar1 = function_name._M_str._4_4_;
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                if (function_name._M_str._4_4_ == function_index) {
                  PrintError(this,"duplicate function name: %u",(ulong)function_name._M_str._4_4_);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                if ((function_index != 0xffffffff) && (function_name._M_str._4_4_ <= function_index)
                   ) {
                  PrintError(this,"function index out of order: %u",
                             (ulong)function_name._M_str._4_4_);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                function_index = function_name._M_str._4_4_;
                IVar4 = NumTotalFuncs(this);
                if (IVar4 <= uVar1) {
                  PrintError(this,"invalid function index: %u",(ulong)function_name._M_str._4_4_);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                local_c8 = (Enum)ReadStr(this,(string_view *)local_c0,"function name");
                bVar2 = Failed((Result)local_c8);
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                _num_funcs = (size_t)local_c0;
                local_d8 = function_name._M_len;
                local_cc = (*this->delegate_->_vptr_BinaryReaderDelegate[0xac])
                                     (this->delegate_,(ulong)function_name._M_str._4_4_,local_c0,
                                      function_name._M_len);
                bVar2 = Succeeded((Result)local_cc);
                if (!bVar2) {
                  PrintError(this,"OnFunctionName callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
              }
              goto LAB_001de431;
            }
            PrintError(this,"OnFunctionNamesCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            name._M_str._4_4_ = 1;
          }
        }
        else {
          PrintError(this,"OnFunctionNameSubsection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          name._M_str._4_4_ = 1;
        }
        break;
      case 2:
        local_e4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xad])
                             (this->delegate_,(ulong)name_type,(ulong)(uint)subsection_size,local_38
                             );
        bVar2 = Succeeded((Result)local_e4);
        if (bVar2) {
          if (local_38 == 0) goto LAB_001de431;
          last_function_index_1 = (Index)ReadCount(this,&local_e8,"function count");
          bVar2 = Failed((Result)last_function_index_1);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            name._M_str._4_4_ = 1;
          }
          else {
            j_1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xae])();
            bVar2 = Succeeded((Result)j_1);
            if (bVar2) {
              function_index_1 = 0xffffffff;
              for (local_f8 = 0; local_f8 < local_e8; local_f8 = local_f8 + 1) {
                local_100 = (Enum)ReadIndex(this,&num_locals,"function index");
                bVar2 = Failed((Result)local_100);
                IVar4 = num_locals;
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                IVar5 = NumTotalFuncs(this);
                if (IVar5 <= IVar4) {
                  PrintError(this,"invalid function index: %u",(ulong)num_locals);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                if ((function_index_1 != 0xffffffff) && (num_locals <= function_index_1)) {
                  PrintError(this,"locals function index out of order: %u",(ulong)num_locals);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                function_index_1 = num_locals;
                RVar3 = ReadCount(this,&local_104,"local count");
                bVar2 = Failed(RVar3);
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                                        (this->delegate_,(ulong)num_locals,(ulong)local_104);
                bVar2 = Succeeded(RVar3);
                if (!bVar2) {
                  PrintError(this,"OnLocalNameLocalCount callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name._M_str._4_4_ = 1;
                  goto LAB_001de488;
                }
                local_index = 0xffffffff;
                for (local_name._M_str._4_4_ = 0; local_name._M_str._4_4_ < local_104;
                    local_name._M_str._4_4_ = local_name._M_str._4_4_ + 1) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_128);
                  local_12c = (Enum)ReadIndex(this,(Index *)&local_name._M_str,"named index");
                  bVar2 = Failed((Result)local_12c);
                  if (bVar2) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name._M_str._4_4_ = 1;
                    goto LAB_001de488;
                  }
                  if ((uint)local_name._M_str == local_index) {
                    PrintError(this,"duplicate local index: %u",(ulong)(uint)local_name._M_str);
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name._M_str._4_4_ = 1;
                    goto LAB_001de488;
                  }
                  if ((local_index != 0xffffffff) && ((uint)local_name._M_str <= local_index)) {
                    PrintError(this,"local index out of order: %u",(ulong)(uint)local_name._M_str);
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name._M_str._4_4_ = 1;
                    goto LAB_001de488;
                  }
                  local_index = (uint)local_name._M_str;
                  local_130 = (Enum)ReadStr(this,(string_view *)local_128,"name");
                  bVar2 = Failed((Result)local_130);
                  if (bVar2) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name._M_str._4_4_ = 1;
                    goto LAB_001de488;
                  }
                  sStack_148 = (size_t)local_128;
                  local_140 = local_name._M_len;
                  local_134 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])
                                        (this->delegate_,(ulong)num_locals,
                                         (ulong)(uint)local_name._M_str,local_128,local_name._M_len)
                  ;
                  bVar2 = Succeeded((Result)local_134);
                  if (!bVar2) {
                    PrintError(this,"OnLocalName callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name._M_str._4_4_ = 1;
                    goto LAB_001de488;
                  }
                }
              }
              goto LAB_001de431;
            }
            PrintError(this,"OnLocalNameFunctionCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            name._M_str._4_4_ = 1;
          }
        }
        else {
          PrintError(this,"OnLocalNameSubsection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          name._M_str._4_4_ = 1;
        }
        break;
      case 3:
        (this->state_).offset = guard.previous_value_;
        goto LAB_001de431;
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
      case 0xb:
        if (local_38 == 0) {
LAB_001de411:
          (this->state_).offset = guard.previous_value_;
          goto LAB_001de431;
        }
        RVar3 = ReadCount(this,&local_14c,"name count");
        bVar2 = Failed(RVar3);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          name._M_str._4_4_ = 1;
        }
        else {
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])();
          bVar2 = Succeeded(RVar3);
          if (bVar2) {
            for (local_158 = 0; local_158 < local_14c; local_158 = local_158 + 1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_170);
              RVar3 = ReadIndex(this,(Index *)((long)&name_1._M_str + 4),"index");
              bVar2 = Failed(RVar3);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                name._M_str._4_4_ = 1;
                goto LAB_001de488;
              }
              RVar3 = ReadStr(this,(string_view *)local_170,"name");
              bVar2 = Failed(RVar3);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                name._M_str._4_4_ = 1;
                goto LAB_001de488;
              }
              RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                                      (this->delegate_,(ulong)uVar1,(ulong)name_1._M_str._4_4_,
                                       local_170,name_1._M_len);
              bVar2 = Succeeded(RVar3);
              if (!bVar2) {
                PrintError(this,"OnNameEntry callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                name._M_str._4_4_ = 1;
                goto LAB_001de488;
              }
            }
            goto LAB_001de411;
          }
          PrintError(this,"OnNameCount callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          name._M_str._4_4_ = 1;
        }
        break;
      default:
        (this->state_).offset = guard.previous_value_;
LAB_001de431:
        name_type = name_type + 1;
        if ((this->state_).offset == guard.previous_value_) {
          name._M_str._4_4_ = 0;
        }
        else {
          PrintError(this,"unfinished sub-section (expected end: 0x%zx)",guard.previous_value_);
          Result::Result((Result *)((long)&this_local + 4),Error);
          name._M_str._4_4_ = 1;
        }
      }
LAB_001de488:
      ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
      ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                          *)local_58);
    } while (name._M_str._4_4_ == 0);
  }
  else {
    PrintError(this,"BeginNamesSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadNameSection(Offset section_size) {
  CALLBACK(BeginNamesSection, section_size);
  Index i = 0;
  uint32_t previous_subsection_type = 0;
  while (state_.offset < read_end_) {
    uint32_t name_type;
    Offset subsection_size;
    CHECK_RESULT(ReadU32Leb128(&name_type, "name type"));
    if (i != 0) {
      ERROR_UNLESS(name_type != previous_subsection_type,
                   "duplicate sub-section");
      ERROR_UNLESS(name_type >= previous_subsection_type,
                   "out-of-order sub-section");
    }
    previous_subsection_type = name_type;
    CHECK_RESULT(ReadOffset(&subsection_size, "subsection size"));
    size_t subsection_end = state_.offset + subsection_size;
    ERROR_UNLESS(subsection_end <= read_end_,
                 "invalid sub-section size: extends past end");
    ReadEndRestoreGuard guard(this);
    read_end_ = subsection_end;

    NameSectionSubsection type = static_cast<NameSectionSubsection>(name_type);
    if (type <= NameSectionSubsection::Last) {
      CALLBACK(OnNameSubsection, i, type, subsection_size);
    }

    switch (type) {
      case NameSectionSubsection::Module:
        CALLBACK(OnModuleNameSubsection, i, name_type, subsection_size);
        if (subsection_size) {
          std::string_view name;
          CHECK_RESULT(ReadStr(&name, "module name"));
          CALLBACK(OnModuleName, name);
        }
        break;
      case NameSectionSubsection::Function:
        CALLBACK(OnFunctionNameSubsection, i, name_type, subsection_size);
        if (subsection_size) {
          Index num_names;
          CHECK_RESULT(ReadCount(&num_names, "name count"));
          CALLBACK(OnFunctionNamesCount, num_names);
          Index last_function_index = kInvalidIndex;

          for (Index j = 0; j < num_names; ++j) {
            Index function_index;
            std::string_view function_name;

            CHECK_RESULT(ReadIndex(&function_index, "function index"));
            ERROR_UNLESS(function_index != last_function_index,
                         "duplicate function name: %u", function_index);
            ERROR_UNLESS(last_function_index == kInvalidIndex ||
                             function_index > last_function_index,
                         "function index out of order: %u", function_index);
            last_function_index = function_index;
            ERROR_UNLESS(function_index < NumTotalFuncs(),
                         "invalid function index: %" PRIindex, function_index);
            CHECK_RESULT(ReadStr(&function_name, "function name"));
            CALLBACK(OnFunctionName, function_index, function_name);
          }
        }
        break;
      case NameSectionSubsection::Local:
        CALLBACK(OnLocalNameSubsection, i, name_type, subsection_size);
        if (subsection_size) {
          Index num_funcs;
          CHECK_RESULT(ReadCount(&num_funcs, "function count"));
          CALLBACK(OnLocalNameFunctionCount, num_funcs);
          Index last_function_index = kInvalidIndex;
          for (Index j = 0; j < num_funcs; ++j) {
            Index function_index;
            CHECK_RESULT(ReadIndex(&function_index, "function index"));
            ERROR_UNLESS(function_index < NumTotalFuncs(),
                         "invalid function index: %u", function_index);
            ERROR_UNLESS(last_function_index == kInvalidIndex ||
                             function_index > last_function_index,
                         "locals function index out of order: %u",
                         function_index);
            last_function_index = function_index;
            Index num_locals;
            CHECK_RESULT(ReadCount(&num_locals, "local count"));
            CALLBACK(OnLocalNameLocalCount, function_index, num_locals);
            Index last_local_index = kInvalidIndex;
            for (Index k = 0; k < num_locals; ++k) {
              Index local_index;
              std::string_view local_name;

              CHECK_RESULT(ReadIndex(&local_index, "named index"));
              ERROR_UNLESS(local_index != last_local_index,
                           "duplicate local index: %u", local_index);
              ERROR_UNLESS(last_local_index == kInvalidIndex ||
                               local_index > last_local_index,
                           "local index out of order: %u", local_index);
              last_local_index = local_index;
              CHECK_RESULT(ReadStr(&local_name, "name"));
              CALLBACK(OnLocalName, function_index, local_index, local_name);
            }
          }
        }
        break;
      case NameSectionSubsection::Label:
        // TODO(sbc): Implement label names. These are slightly more complicated
        // since they refer to offsets in the code section / instruction stream.
        state_.offset = subsection_end;
        break;
      case NameSectionSubsection::Type:
      case NameSectionSubsection::Table:
      case NameSectionSubsection::Memory:
      case NameSectionSubsection::Global:
      case NameSectionSubsection::ElemSegment:
      case NameSectionSubsection::DataSegment:
      case NameSectionSubsection::Tag:
        if (subsection_size) {
          Index num_names;
          CHECK_RESULT(ReadCount(&num_names, "name count"));
          CALLBACK(OnNameCount, num_names);
          for (Index j = 0; j < num_names; ++j) {
            Index index;
            std::string_view name;

            CHECK_RESULT(ReadIndex(&index, "index"));
            CHECK_RESULT(ReadStr(&name, "name"));
            CALLBACK(OnNameEntry, type, index, name);
          }
        }
        state_.offset = subsection_end;
        break;
      default:
        // Unknown subsection, skip it.
        state_.offset = subsection_end;
        break;
    }
    ++i;
    ERROR_UNLESS(state_.offset == subsection_end,
                 "unfinished sub-section (expected end: 0x%" PRIzx ")",
                 subsection_end);
  }
  CALLBACK0(EndNamesSection);
  return Result::Ok;
}